

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LzmaEnc.cpp
# Opt level: O1

void crnlib::LzmaEnc_SaveState(CLzmaEncHandle pp)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  long lVar8;
  long lVar9;
  undefined8 *puVar10;
  undefined8 *puVar11;
  byte bVar12;
  
  bVar12 = 0;
  memcpy((void *)((long)pp + 0x3d9e4),(void *)((long)pp + 0x3424c),0x4848);
  memcpy((void *)((long)pp + 0x4222c),(void *)((long)pp + 0x38a94),0x4848);
  *(undefined4 *)((long)pp + 0x46a84) = *(undefined4 *)((long)pp + 0x32f80);
  lVar8 = -0x180;
  do {
    puVar10 = (undefined8 *)((long)pp + lVar8 + 0x33d68);
    uVar1 = *puVar10;
    uVar2 = puVar10[1];
    puVar11 = (undefined8 *)((long)pp + lVar8 + 0x33d78);
    uVar3 = puVar11[1];
    puVar10 = (undefined8 *)((long)pp + lVar8 + 0x33f48);
    uVar4 = *puVar10;
    uVar5 = puVar10[1];
    puVar10 = (undefined8 *)((long)pp + lVar8 + 0x33f58);
    uVar6 = *puVar10;
    uVar7 = puVar10[1];
    puVar10 = (undefined8 *)((long)pp + lVar8 + 0x3d510);
    *puVar10 = *puVar11;
    puVar10[1] = uVar3;
    puVar10 = (undefined8 *)((long)pp + lVar8 + 0x3d500);
    *puVar10 = uVar1;
    puVar10[1] = uVar2;
    puVar10 = (undefined8 *)((long)pp + lVar8 + 0x3d6e0);
    *puVar10 = uVar4;
    puVar10[1] = uVar5;
    puVar10 = (undefined8 *)((long)pp + lVar8 + 0x3d6f0);
    *puVar10 = uVar6;
    puVar10[1] = uVar7;
    lVar8 = lVar8 + 0x20;
  } while (lVar8 != 0);
  lVar8 = 0;
  do {
    puVar10 = (undefined8 *)((long)pp + lVar8 + 0x33f48);
    puVar11 = (undefined8 *)((long)pp + lVar8 + 0x3d6e0);
    for (lVar9 = 0x10; lVar9 != 0; lVar9 = lVar9 + -1) {
      *puVar11 = *puVar10;
      puVar10 = puVar10 + (ulong)bVar12 * -2 + 1;
      puVar11 = puVar11 + (ulong)bVar12 * -2 + 1;
    }
    lVar8 = lVar8 + 0x80;
  } while (lVar8 != 0x200);
  *(undefined8 *)((long)pp + 0x3d510) = *(undefined8 *)((long)pp + 0x33d78);
  *(undefined8 *)((long)pp + 0x3d500) = *(undefined8 *)((long)pp + 0x33d68);
  *(undefined8 *)((long)pp + 0x3d508) = *(undefined8 *)((long)pp + 0x33d70);
  *(undefined8 *)((long)pp + 0x3d518) = *(undefined8 *)((long)pp + 0x33d80);
  *(undefined8 *)((long)pp + 0x3d520) = *(undefined8 *)((long)pp + 0x33d88);
  *(undefined8 *)((long)pp + 0x3d528) = *(undefined8 *)((long)pp + 0x33d90);
  *(undefined8 *)((long)pp + 0x3d530) = *(undefined8 *)((long)pp + 0x33d98);
  *(undefined8 *)((long)pp + 0x3d538) = *(undefined8 *)((long)pp + 0x33da0);
  *(undefined8 *)((long)pp + 0x3d540) = *(undefined8 *)((long)pp + 0x33da8);
  *(undefined8 *)((long)pp + 0x3d548) = *(undefined8 *)((long)pp + 0x33db0);
  *(undefined8 *)((long)pp + 0x3d550) = *(undefined8 *)((long)pp + 0x33db8);
  *(undefined8 *)((long)pp + 0x3d558) = *(undefined8 *)((long)pp + 0x33dc0);
  memcpy((void *)((long)pp + 0x3d8e0),(void *)((long)pp + 0x34148),0xe4);
  *(undefined8 *)((long)pp + 0x3d9c4) = *(undefined8 *)((long)pp + 0x3422c);
  *(undefined8 *)((long)pp + 0x3d9cc) = *(undefined8 *)((long)pp + 0x34234);
  *(undefined8 *)((long)pp + 0x3d9d4) = *(undefined8 *)((long)pp + 0x3423c);
  *(undefined8 *)((long)pp + 0x3d9dc) = *(undefined8 *)((long)pp + 0x34244);
  *(undefined8 *)((long)pp + 0x46a74) = *(undefined8 *)((long)pp + 0x32f70);
  *(undefined8 *)((long)pp + 0x46a7c) = *(undefined8 *)((long)pp + 0x32f78);
  memcpy(*(void **)((long)pp + 0x3d378),*(void **)((long)pp + 0x33be0),
         (long)(0x300 << (*(byte *)((long)pp + 0x3d2dc) & 0x1f)) * 2);
  return;
}

Assistant:

void LzmaEnc_SaveState(CLzmaEncHandle pp) {
  CLzmaEnc* p = (CLzmaEnc*)pp;
  CSaveState* dest = &p->saveState;
  int i;
  dest->lenEnc = p->lenEnc;
  dest->repLenEnc = p->repLenEnc;
  dest->state = p->state;

  for (i = 0; i < kNumStates; i++) {
    memcpy(dest->isMatch[i], p->isMatch[i], sizeof(p->isMatch[i]));
    memcpy(dest->isRep0Long[i], p->isRep0Long[i], sizeof(p->isRep0Long[i]));
  }
  for (i = 0; i < kNumLenToPosStates; i++)
    memcpy(dest->posSlotEncoder[i], p->posSlotEncoder[i], sizeof(p->posSlotEncoder[i]));
  memcpy(dest->isRep, p->isRep, sizeof(p->isRep));
  memcpy(dest->isRepG0, p->isRepG0, sizeof(p->isRepG0));
  memcpy(dest->isRepG1, p->isRepG1, sizeof(p->isRepG1));
  memcpy(dest->isRepG2, p->isRepG2, sizeof(p->isRepG2));
  memcpy(dest->posEncoders, p->posEncoders, sizeof(p->posEncoders));
  memcpy(dest->posAlignEncoder, p->posAlignEncoder, sizeof(p->posAlignEncoder));
  memcpy(dest->reps, p->reps, sizeof(p->reps));
  memcpy(dest->litProbs, p->litProbs, (0x300 << p->lclp) * sizeof(CLzmaProb));
}